

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O3

int mp3dec_detect_cb(mp3dec_io_t *io,uint8_t *buf,size_t buf_size)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int frame_size;
  int free_format_bytes;
  size_t local_38;
  int local_30;
  int local_2c;
  
  if (buf_size == 0xffffffffffffffff || buf == (uint8_t *)0x0) {
    return -1;
  }
  if (io != (mp3dec_io_t *)0x0 && buf_size < 0x4000) {
    return -1;
  }
  local_38 = buf_size;
  if (io != (mp3dec_io_t *)0x0) {
    iVar2 = (*io->seek)(0,io->seek_data);
    if (iVar2 != 0) {
      return -3;
    }
    local_38 = (*io->read)(buf,10,io->read_data);
    if (10 < local_38) {
      return -3;
    }
  }
  sVar1 = local_38;
  iVar2 = -4;
  if (9 < local_38) {
    sVar3 = mp3dec_skip_id3v2(buf,local_38);
    iVar2 = 0;
    if (sVar3 == 0) {
      if (io == (mp3dec_io_t *)0x0) {
        mp3dec_skip_id3v1(buf,&local_38);
        uVar4 = 0x4000;
        if (local_38 < 0x4000) {
          uVar4 = local_38;
        }
      }
      else {
        local_38 = (*io->read)(buf + 10,buf_size - 10,io->read_data);
        if (buf_size - 10 < local_38) {
          return -3;
        }
        local_38 = local_38 + sVar1;
        uVar4 = local_38;
        if (local_38 < 0x4000) {
          mp3dec_skip_id3v1(buf,&local_38);
          uVar4 = local_38;
        }
      }
      mp3d_find_frame(buf,(int)uVar4,&local_2c,&local_30);
      iVar2 = (uint)(local_30 != 0) * 4 + -4;
    }
  }
  return iVar2;
}

Assistant:

int mp3dec_detect_cb(mp3dec_io_t *io, uint8_t *buf, size_t buf_size)
{
    if (!buf || (size_t)-1 == buf_size || (io && buf_size < MINIMP3_BUF_SIZE))
        return MP3D_E_PARAM;
    size_t filled = buf_size;
    if (io)
    {
        if (io->seek(0, io->seek_data))
            return MP3D_E_IOERROR;
        filled = io->read(buf, MINIMP3_ID3_DETECT_SIZE, io->read_data);
        if (filled > MINIMP3_ID3_DETECT_SIZE)
            return MP3D_E_IOERROR;
    }
    if (filled < MINIMP3_ID3_DETECT_SIZE)
        return MP3D_E_USER; /* too small, can't be mp3/mpa */
    if (mp3dec_skip_id3v2(buf, filled))
        return 0; /* id3v2 tag is enough evidence */
    if (io)
    {
        size_t readed = io->read(buf + MINIMP3_ID3_DETECT_SIZE, buf_size - MINIMP3_ID3_DETECT_SIZE, io->read_data);
        if (readed > (buf_size - MINIMP3_ID3_DETECT_SIZE))
            return MP3D_E_IOERROR;
        filled += readed;
        if (filled < MINIMP3_BUF_SIZE)
            mp3dec_skip_id3v1(buf, &filled);
    } else
    {
        mp3dec_skip_id3v1(buf, &filled);
        if (filled > MINIMP3_BUF_SIZE)
            filled = MINIMP3_BUF_SIZE;
    }
    int free_format_bytes, frame_size;
    mp3d_find_frame(buf, filled, &free_format_bytes, &frame_size);
    if (frame_size)
        return 0; /* MAX_FRAME_SYNC_MATCHES consecutive frames found */
    return MP3D_E_USER;
}